

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

t_int * vline_tilde_perform(t_int *w)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  double *fatso;
  int iVar7;
  float *pfVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_50;
  
  lVar6 = w[1];
  pfVar8 = (float *)w[2];
  iVar5 = (int)w[3];
  local_50 = *(double *)(lVar6 + 0x30);
  dVar11 = *(double *)(lVar6 + 0x38);
  dVar2 = *(double *)(lVar6 + 0x60);
  dVar9 = clock_gettimesince(*(double *)(lVar6 + 0x40));
  fatso = *(double **)(lVar6 + 0x80);
  if ((dVar9 != *(double *)(lVar6 + 0x48)) || (NAN(dVar9) || NAN(*(double *)(lVar6 + 0x48)))) {
    iVar7 = 0x40;
    if (0x40 < iVar5) {
      iVar7 = iVar5;
    }
    *(double *)(lVar6 + 0x48) = dVar9;
    dVar9 = dVar9 - (double)iVar7 * dVar2;
  }
  else {
    dVar9 = *(double *)(lVar6 + 0x50);
  }
  *(double *)(lVar6 + 0x50) = (double)iVar5 * dVar2 + dVar9;
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      dVar9 = dVar9 + dVar2;
      if (fatso == (double *)0x0) {
        fatso = (double *)0x0;
      }
      else {
        dVar3 = fatso[1];
        while (dVar3 < dVar9) {
          if (*(double *)(lVar6 + 0x68) <= dVar9) {
            local_50 = (double)*(float *)(lVar6 + 0x70);
          }
          dVar4 = *fatso;
          fVar1 = *(float *)(fatso + 2);
          dVar10 = (double)fVar1;
          dVar11 = 0.0;
          if (dVar3 < dVar4) {
            dVar10 = (dVar10 - local_50) / (dVar4 - dVar3);
            dVar11 = dVar10 * dVar2;
            dVar10 = (dVar9 - dVar3) * dVar10 + local_50;
          }
          local_50 = dVar10;
          *(double *)(lVar6 + 0x38) = dVar11;
          *(float *)(lVar6 + 0x70) = fVar1;
          *(double *)(lVar6 + 0x68) = dVar4;
          *(double *)(lVar6 + 0x80) = fatso[3];
          freebytes(fatso,0x20);
          fatso = *(double **)(lVar6 + 0x80);
          if (fatso == (double *)0x0) {
            fatso = (double *)0x0;
            break;
          }
          dVar3 = fatso[1];
        }
      }
      if (*(double *)(lVar6 + 0x68) <= dVar9) {
        local_50 = (double)*(float *)(lVar6 + 0x70);
        *(undefined8 *)(lVar6 + 0x38) = 0;
        *(undefined8 *)(lVar6 + 0x68) = 0x4415af1d78b58c40;
        dVar11 = 0.0;
      }
      *pfVar8 = (float)local_50;
      pfVar8 = pfVar8 + 1;
      local_50 = local_50 + dVar11;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar5);
  }
  *(double *)(lVar6 + 0x30) = local_50;
  return w + 4;
}

Assistant:

static t_int *vline_tilde_perform(t_int *w)
{
    t_vline *x = (t_vline *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]), i;
    double f = x->x_value;
    double inc = x->x_inc;
    double msecpersamp = x->x_msecpersamp;
    double timenow, logicaltimenow = clock_gettimesince(x->x_referencetime);
    t_vseg *s = x->x_list;
    if (logicaltimenow != x->x_lastlogicaltime)
    {
        int sampstotime = (n > DEFDACBLKSIZE ? n : DEFDACBLKSIZE);
        x->x_lastlogicaltime = logicaltimenow;
        x->x_nextblocktime = logicaltimenow - sampstotime * msecpersamp;
    }
    timenow = x->x_nextblocktime;
    x->x_nextblocktime = timenow + n * msecpersamp;
    for (i = 0; i < n; i++)
    {
        double timenext = timenow + msecpersamp;
    checknext:
        if (s)
        {
            /* has starttime elapsed?  If so update value and increment */
            if (s->s_starttime < timenext)
            {
                if (x->x_targettime <= timenext)
                    f = x->x_target, inc = 0;
                    /* if zero-length segment bash output value */
                if (s->s_targettime <= s->s_starttime)
                {
                    f = s->s_target;
                    inc = 0;
                }
                else
                {
                    double incpermsec = (s->s_target - f)/
                        (s->s_targettime - s->s_starttime);
                    f = f + incpermsec * (timenext - s->s_starttime);
                    inc = incpermsec * msecpersamp;
                }
                x->x_inc = inc;
                x->x_target = s->s_target;
                x->x_targettime = s->s_targettime;
                x->x_list = s->s_next;
                t_freebytes(s, sizeof(*s));
                s = x->x_list;
                goto checknext;
            }
        }
        if (x->x_targettime <= timenext)
            f = x->x_target, inc = x->x_inc = 0, x->x_targettime = 1e20;
        *out++ = f;
        f = f + inc;
        timenow = timenext;
    }
    x->x_value = f;
    return (w+4);
}